

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

bool UTF_uc8_to_uc32(UTF_UC8 *uc8,UTF_UC32 *uc32)

{
  undefined1 uVar1;
  uint uVar2;
  
  uVar2 = UTF_uc8_count(*uc8);
  uVar1 = (*(code *)(&DAT_00105004 + *(int *)(&DAT_00105004 + (ulong)uVar2 * 4)))();
  return (bool)uVar1;
}

Assistant:

static __inline bool
UTF_uc8_to_uc32(const UTF_UC8 uc8[4], UTF_UC32 *uc32)
{
    int count = UTF_uc8_count(uc8[0]);
    if (!count)
        return false;

    switch (count)
    {
    case 1:
        *uc32 = uc8[0];
        break;

    case 2:
        if (!UTF_uc8_is_trail(uc8[1]))
            return false;

        if ((uc8[0] & 0x1E) == 0)
            return false;

        *uc32 = (UTF_STATIC_CAST(UTF_UC32, uc8[0] & 0x1F) << 6);
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[1] & 0x3F);
        break;

    case 3:
        if (!UTF_uc8_is_trail(uc8[1]) || !UTF_uc8_is_trail(uc8[2]))
            return false;

        if ((uc8[0] & 0x0F) == 0 && (uc8[1] & 0x20) == 0)
            return false;

        *uc32 = UTF_STATIC_CAST(UTF_UC32, uc8[0] & 0x0F) << 12;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[1] & 0x3F) << 6;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[2] & 0x3F);
        break;

    case 4:
        if (!UTF_uc8_is_trail(uc8[1]) ||
            !UTF_uc8_is_trail(uc8[2]) ||
            !UTF_uc8_is_trail(uc8[3]))
        {
            return false;
        }

        if ((uc8[0] & 0x07) == 0 && (uc8[1] & 0x30) == 0)
            return false;

        *uc32 = UTF_STATIC_CAST(UTF_UC32, uc8[0] & 0x07) << 18;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[1] & 0x3F) << 12;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[2] & 0x3F) << 6;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[3] & 0x3F);
        break;

    default:
        return false;
    }

    return true;
}